

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

bool __thiscall QTemporaryFileEngine::isUnnamedFile(QTemporaryFileEngine *this)

{
  QTemporaryFileEngine *this_local;
  
  return (bool)(this->unnamedFile & 1);
}

Assistant:

bool QTemporaryFileEngine::isUnnamedFile() const
{
#ifdef LINUX_UNNAMED_TMPFILE
    if (unnamedFile) {
        Q_ASSERT(d_func()->fileEntry.isEmpty());
        Q_ASSERT(filePathIsTemplate);
    }
    return unnamedFile;
#else
    return false;
#endif
}